

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void ARM_post_printer(csh ud,cs_insn *insn,char *insn_asm,MCInst *mci)

{
  int iVar1;
  char *pcVar2;
  size_t __n;
  long in_RCX;
  char *in_RDX;
  uint *in_RSI;
  long in_RDI;
  uint j;
  uint i;
  uint local_28;
  uint local_24;
  
  if (*(int *)(in_RDI + 0x60) == 3) {
    if (((*(byte *)(in_RCX + 0x32e) & 1) == 0) &&
       (pcVar2 = strrchr(in_RDX,0x21), pcVar2 == (char *)0x0)) {
      if ((*(uint *)(*(long *)(in_RCX + 800) + 4) & 0x10) == 0) {
        switch(*(undefined4 *)(in_RCX + 8)) {
        case 0x84:
        case 0x85:
        case 0x88:
        case 0x89:
        case 0x8c:
        case 0x8d:
        case 0x90:
        case 0x91:
        case 0x9b:
        case 0x9e:
        case 0xa5:
        case 0xa6:
        case 0xae:
        case 0xaf:
        case 0xb6:
        case 0xb7:
        case 0xbb:
        case 0xbc:
        case 0xc0:
        case 0xc1:
        case 0x187:
        case 0x188:
        case 0x18b:
        case 0x18c:
        case 399:
        case 400:
        case 0x193:
        case 0x194:
        case 0x1a4:
        case 0x1a7:
        case 0x1b0:
        case 0x1b1:
        case 0x1b9:
        case 0x1ba:
        case 0x1bf:
        case 0x1c0:
          *(undefined1 *)(*(long *)(in_RSI + 0x3c) + 0x71) = 1;
          break;
        default:
        }
      }
      else {
        switch(*(undefined4 *)(in_RCX + 8)) {
        case 0x937:
        case 0x938:
        case 0x93b:
        case 0x93c:
        case 0x93f:
        case 0x940:
        case 0x943:
        case 0x944:
        case 0x94b:
        case 0x94c:
        case 0x952:
        case 0x953:
        case 0x95a:
        case 0x95b:
        case 0x962:
        case 0x963:
        case 0x96a:
        case 0x96b:
        case 0x972:
        case 0x973:
        case 0xa18:
        case 0xa19:
        case 0xa1c:
        case 0xa1d:
        case 0xa20:
        case 0xa21:
        case 0xa24:
        case 0xa25:
        case 0xa32:
        case 0xa33:
        case 0xa38:
        case 0xa39:
        case 0xa40:
        case 0xa41:
        case 0xa47:
        case 0xa48:
          *(undefined1 *)(*(long *)(in_RSI + 0x3c) + 0x71) = 1;
          break;
        default:
        }
      }
    }
    else {
      *(undefined1 *)(*(long *)(in_RSI + 0x3c) + 0x71) = 1;
    }
    if ((*(byte *)(*(long *)(in_RSI + 0x3c) + 0x70) & 1) == 0) {
      for (local_24 = 0; local_24 < 0x1d; local_24 = local_24 + 1) {
        if (*in_RSI == insn_update_flgs[local_24].id) {
          pcVar2 = insn_update_flgs[local_24].name;
          __n = strlen(insn_update_flgs[local_24].name);
          iVar1 = strncmp(in_RDX,pcVar2,__n);
          if (iVar1 == 0) {
            *(undefined1 *)(*(long *)(in_RSI + 0x3c) + 0x70) = 1;
            local_28 = 0;
            goto LAB_002b8468;
          }
        }
      }
    }
LAB_002b84ca:
    if (*(int *)(*(long *)(in_RSI + 0x3c) + 0x6c) == 0) {
      *(undefined4 *)(*(long *)(in_RSI + 0x3c) + 0x6c) = 0xf;
    }
    if (*(int *)(in_RCX + 8) == 0xda) {
      *(undefined4 *)(*(long *)(in_RSI + 0x3c) + 0x8c) = 1;
      *(undefined4 *)(*(long *)(in_RSI + 0x3c) + 0x90) = 0xb;
      *(undefined1 *)(*(long *)(in_RSI + 0x3c) + 0xa9) = 2;
      *(undefined4 *)(*(long *)(in_RSI + 0x3c) + 0xbc) = 1;
      *(undefined4 *)(*(long *)(in_RSI + 0x3c) + 0xc0) = 10;
      *(undefined1 *)(*(long *)(in_RSI + 0x3c) + 0xd9) = 1;
      *(undefined1 *)(*(long *)(in_RSI + 0x3c) + 0x78) = 2;
    }
  }
  return;
LAB_002b8468:
  if (0x13 < local_28) goto LAB_002b84ca;
  if (*(short *)(*(long *)(in_RSI + 0x3c) + 0x22 + (ulong)local_28 * 2) == 0) {
    *(undefined2 *)(*(long *)(in_RSI + 0x3c) + 0x22 + (ulong)local_28 * 2) = 3;
    goto LAB_002b84ca;
  }
  local_28 = local_28 + 1;
  goto LAB_002b8468;
}

Assistant:

void ARM_post_printer(csh ud, cs_insn *insn, char *insn_asm, MCInst *mci)
{
	if (((cs_struct *)ud)->detail != CS_OPT_ON)
		return;

	// check if this insn requests write-back
	if (mci->writeback || (strrchr(insn_asm, '!')) != NULL) {
		insn->detail->arm.writeback = true;
	} else if (mci->csh->mode & CS_MODE_THUMB) {
		// handle some special instructions with writeback
        //printf(">> Opcode = %u\n", mci->Opcode);
		switch(mci->Opcode) {
			default:
				break;
			case ARM_t2LDC2L_PRE:
			case ARM_t2LDC2_PRE:
			case ARM_t2LDCL_PRE:
			case ARM_t2LDC_PRE:

			case ARM_t2LDRB_PRE:
			case ARM_t2LDRD_PRE:
			case ARM_t2LDRH_PRE:
			case ARM_t2LDRSB_PRE:
			case ARM_t2LDRSH_PRE:
			case ARM_t2LDR_PRE:

			case ARM_t2STC2L_PRE:
			case ARM_t2STC2_PRE:
			case ARM_t2STCL_PRE:
			case ARM_t2STC_PRE:

			case ARM_t2STRB_PRE:
			case ARM_t2STRD_PRE:
			case ARM_t2STRH_PRE:
			case ARM_t2STR_PRE:

			case ARM_t2LDC2L_POST:
			case ARM_t2LDC2_POST:
			case ARM_t2LDCL_POST:
			case ARM_t2LDC_POST:

			case ARM_t2LDRB_POST:
			case ARM_t2LDRD_POST:
			case ARM_t2LDRH_POST:
			case ARM_t2LDRSB_POST:
			case ARM_t2LDRSH_POST:
			case ARM_t2LDR_POST:

			case ARM_t2STC2L_POST:
			case ARM_t2STC2_POST:
			case ARM_t2STCL_POST:
			case ARM_t2STC_POST:

			case ARM_t2STRB_POST:
			case ARM_t2STRD_POST:
			case ARM_t2STRH_POST:
			case ARM_t2STR_POST:
				insn->detail->arm.writeback = true;
				break;
		}
	} else {	// ARM mode
		// handle some special instructions with writeback
        //printf(">> Opcode = %u\n", mci->Opcode);
		switch(mci->Opcode) {
			default:
				break;
			case ARM_LDC2L_PRE:
			case ARM_LDC2_PRE:
			case ARM_LDCL_PRE:
			case ARM_LDC_PRE:

			case ARM_LDRD_PRE:
			case ARM_LDRH_PRE:
			case ARM_LDRSB_PRE:
			case ARM_LDRSH_PRE:

			case ARM_STC2L_PRE:
			case ARM_STC2_PRE:
			case ARM_STCL_PRE:
			case ARM_STC_PRE:

			case ARM_STRD_PRE:
			case ARM_STRH_PRE:

			case ARM_LDC2L_POST:
			case ARM_LDC2_POST:
			case ARM_LDCL_POST:
			case ARM_LDC_POST:

			case ARM_LDRBT_POST:
			case ARM_LDRD_POST:
			case ARM_LDRH_POST:
			case ARM_LDRSB_POST:
			case ARM_LDRSH_POST:

			case ARM_STC2L_POST:
			case ARM_STC2_POST:
			case ARM_STCL_POST:
			case ARM_STC_POST:

			case ARM_STRBT_POST:
			case ARM_STRD_POST:
			case ARM_STRH_POST:

			case ARM_LDRB_POST_IMM:
			case ARM_LDR_POST_IMM:
			case ARM_LDR_POST_REG:
			case ARM_STRB_POST_IMM:

			case ARM_STR_POST_IMM:
			case ARM_STR_POST_REG:

				insn->detail->arm.writeback = true;
				break;
		}
	}

	// check if this insn requests update flags
	if (insn->detail->arm.update_flags == false) {
		// some insn still update flags, regardless of tabgen info
		unsigned int i, j;

		for (i = 0; i < ARR_SIZE(insn_update_flgs); i++) {
			if (insn->id == insn_update_flgs[i].id &&
					!strncmp(insn_asm, insn_update_flgs[i].name,
						strlen(insn_update_flgs[i].name))) {
				insn->detail->arm.update_flags = true;
				// we have to update regs_write array as well
				for (j = 0; j < ARR_SIZE(insn->detail->regs_write); j++) {
					if (insn->detail->regs_write[j] == 0) {
						insn->detail->regs_write[j] = ARM_REG_CPSR;
						break;
					}
				}
				break;
			}
		}
	}

	// instruction should not have invalid CC
	if (insn->detail->arm.cc == ARM_CC_INVALID) {
		insn->detail->arm.cc = ARM_CC_AL;
	}

	// manual fix for some special instructions
	// printf(">>> id: %u, mcid: %u\n", insn->id, mci->Opcode);
	switch(mci->Opcode) {
		default:
			break;
		case ARM_MOVPCLR:
			insn->detail->arm.operands[0].type = ARM_OP_REG;
			insn->detail->arm.operands[0].reg = ARM_REG_PC;
			insn->detail->arm.operands[0].access = CS_AC_WRITE;
			insn->detail->arm.operands[1].type = ARM_OP_REG;
			insn->detail->arm.operands[1].reg = ARM_REG_LR;
			insn->detail->arm.operands[1].access = CS_AC_READ;
			insn->detail->arm.op_count = 2;
			break;
	}
}